

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cc
# Opt level: O3

void gimage::extractContour(Polygon *p,ImageU8 *mask,ImageU8 *image,long sx,long sy,int dir)

{
  uchar uVar1;
  pointer pSVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  SVector<long,_2> local_40;
  
  pSVar2 = (p->vertex).
           super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((p->vertex).
      super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>._M_impl
      .super__Vector_impl_data._M_finish != pSVar2) {
    (p->vertex).
    super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar2;
  }
  local_40.v[0] = sx;
  local_40.v[1] = sy;
  std::vector<gmath::SVector<long,2>,std::allocator<gmath::SVector<long,2>>>::
  emplace_back<gmath::SVector<long,2>>
            ((vector<gmath::SVector<long,2>,std::allocator<gmath::SVector<long,2>>> *)p,&local_40);
  lVar3 = sx;
  lVar4 = sy;
  do {
    uVar1 = (*image->img)[lVar4][lVar3];
    (*mask->img)[lVar4][lVar3] = 0xff;
    uVar6 = dir + 8;
    if (-1 < (int)(dir + 1U)) {
      uVar6 = dir + 1U;
    }
    iVar5 = (dir - (uVar6 & 0xfffffff8)) + 1;
    if (iVar5 == dir) {
      return;
    }
    while( true ) {
      lVar8 = *(long *)((anonymous_namespace)::
                        nextContourPixel(long&,long&,int&,gimage::Image<unsigned_char,gimage::PixelTraits<unsigned_char>>&,gimage::Image<unsigned_char,gimage::PixelTraits<unsigned_char>>const&,long,long)
                        ::dx + (long)iVar5 * 8) + lVar3;
      lVar7 = *(long *)((anonymous_namespace)::
                        nextContourPixel(long&,long&,int&,gimage::Image<unsigned_char,gimage::PixelTraits<unsigned_char>>&,gimage::Image<unsigned_char,gimage::PixelTraits<unsigned_char>>const&,long,long)
                        ::dy + (long)iVar5 * 8) + lVar4;
      if (lVar7 == sy && lVar8 == sx) {
        return;
      }
      if ((((-1 < lVar8) && (-1 < lVar7)) && (lVar8 < image->width)) &&
         (((lVar7 < image->height && ((*image->img)[lVar7][lVar8] == uVar1)) &&
          ((*mask->img)[lVar7][lVar8] == '\0')))) break;
      uVar6 = iVar5 + 8;
      if (-1 < (int)(iVar5 + 1U)) {
        uVar6 = iVar5 + 1U;
      }
      iVar5 = (iVar5 - (uVar6 & 0xfffffff8)) + 1;
      if (iVar5 == dir) {
        return;
      }
    }
    dir = (int)((char)((char)iVar5 + '\x04') % '\b');
    local_40.v[0] = lVar8;
    local_40.v[1] = lVar7;
    std::vector<gmath::SVector<long,2>,std::allocator<gmath::SVector<long,2>>>::
    emplace_back<gmath::SVector<long,2>>
              ((vector<gmath::SVector<long,2>,std::allocator<gmath::SVector<long,2>>> *)p,&local_40)
    ;
    lVar3 = lVar8;
    lVar4 = lVar7;
  } while( true );
}

Assistant:

void extractContour(Polygon &p, ImageU8 &mask, const ImageU8 &image, long sx, long sy, int dir)
{
  long x=sx;
  long y=sy;

  p.clear();
  p.add(x, y);

  while (nextContourPixel(x, y, dir, mask, image, sx, sy))
  {
    p.add(x, y);
  }
}